

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O2

Option * google::protobuf::Arena::CreateMaybeMessage<google::protobuf::Option>(Arena *arena)

{
  Option *this;
  
  if (arena == (Arena *)0x0) {
    this = (Option *)operator_new(0x28);
    Option::Option(this);
  }
  else {
    AllocHook(arena,(type_info *)&Option::typeinfo,0x28);
    this = (Option *)AllocateAlignedNoHook(arena,0x28);
    Option::Option(this,arena);
  }
  return this;
}

Assistant:

PROTOBUF_NOINLINE PROTOBUF_NAMESPACE_ID::Option* Arena::CreateMaybeMessage< PROTOBUF_NAMESPACE_ID::Option >(Arena* arena) {
  return Arena::CreateMessageInternal< PROTOBUF_NAMESPACE_ID::Option >(arena);
}